

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O3

ROMImage * MT32Emu::ROMImage::makeROMImage(File *file1,File *file2)

{
  ROMImage *romImage1;
  ROMImage *romImage2;
  ROMImage *pRVar1;
  long lVar2;
  undefined **ppuVar3;
  undefined8 *puVar4;
  
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar3 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar4 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar2 = 0xe; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *ppuVar3;
      ppuVar3 = ppuVar3 + 1;
      puVar4 = puVar4 + 1;
    }
    ppuVar3 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar4 = &DAT_001359d0;
    for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *ppuVar3;
      ppuVar3 = ppuVar3 + 1;
      puVar4 = puVar4 + 1;
    }
  }
  romImage1 = makeROMImage(file1,(ROMInfo **)&getROMInfoLists()::PARTIAL_ROM_INFOS);
  romImage2 = makeROMImage(file2,(ROMInfo **)&getROMInfoLists()::PARTIAL_ROM_INFOS);
  if ((romImage1->romInfo == (ROMInfo *)0x0) || (romImage2->romInfo == (ROMInfo *)0x0)) {
    pRVar1 = (ROMImage *)0x0;
  }
  else {
    pRVar1 = mergeROMImages(romImage1,romImage2);
  }
  freeROMImage(romImage1);
  freeROMImage(romImage2);
  return pRVar1;
}

Assistant:

const ROMImage *ROMImage::makeROMImage(File *file1, File *file2) {
	const ROMInfo * const *partialROMInfos = getROMInfoLists().partialROMInfos.romInfos;
	const ROMImage *image1 = makeROMImage(file1, partialROMInfos);
	const ROMImage *image2 = makeROMImage(file2, partialROMInfos);
	const ROMImage *fullImage = image1->getROMInfo() == NULL || image2->getROMInfo() == NULL ? NULL : mergeROMImages(image1, image2);
	freeROMImage(image1);
	freeROMImage(image2);
	return fullImage;
}